

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

HighsInt __thiscall HFactor::buildKernel(HFactor *this)

{
  pointer *ppcVar1;
  uint *puVar2;
  int iVar3;
  iterator iVar4;
  iterator __position;
  iterator iVar5;
  pointer piVar6;
  pointer pcVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer piVar11;
  bool bVar12;
  bool bVar13;
  vector<int,std::allocator<int>> *this_00;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  int *piVar24;
  double *__args;
  size_t sVar25;
  pointer pdVar26;
  int iVar27;
  int iVar28;
  uint *puVar29;
  HFactor *pHVar30;
  size_type sVar31;
  long lVar32;
  long lVar33;
  pointer piVar34;
  pointer pdVar35;
  int *piVar36;
  uint uVar37;
  pointer piVar38;
  int iVar39;
  pointer piVar40;
  pointer pdVar41;
  undefined4 uVar42;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar43;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  HighsInt iRowPivot;
  HighsInt iRow;
  double value;
  double pivot_multiplier;
  uint local_19c;
  HFactor *local_198;
  pointer local_190;
  double local_188;
  int local_180;
  uint local_17c;
  pointer local_178;
  double local_170;
  ulong local_168;
  pointer local_160;
  double local_158;
  ulong local_150;
  double local_148;
  long local_140;
  double local_138;
  pointer local_130;
  ulong local_128;
  double local_120;
  pointer local_118;
  ulong local_110;
  size_type local_108;
  long local_100;
  vector<double,_std::allocator<double>_> *local_f8;
  vector<int,_std::allocator<int>_> *local_f0;
  pointer local_e8;
  pointer local_e0;
  double local_d8;
  int local_cc;
  double local_c8;
  HighsLogOptions *local_c0;
  ulong local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  undefined1 local_a8 [16];
  vector<int,_std::allocator<int>_> *local_98;
  vector<double,std::allocator<double>> *local_90;
  vector<int,std::allocator<int>> *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<signed_char,std::allocator<signed_char>> *local_78;
  vector<int,std::allocator<int>> *local_70;
  vector<int,std::allocator<int>> *local_68;
  vector<int,std::allocator<int>> *local_60;
  long local_58;
  double local_50;
  vector<double,std::allocator<double>> *local_48;
  vector<double,std::allocator<double>> *local_40;
  vector<int,std::allocator<int>> *local_38;
  
  local_50 = this->time_limit_;
  iVar17 = this->nwork;
  uVar16 = iVar17 - 1;
  this->nwork = uVar16;
  local_198 = this;
  if (iVar17 < 1) {
    local_158 = 0.0;
    local_188 = 0.0;
    uVar42 = 0;
    uVar43 = 0;
  }
  else {
    local_f0 = &this->mc_index;
    local_b0 = &this->mr_index;
    local_f8 = &this->mc_value;
    local_68 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_row;
    local_70 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_var;
    local_78 = (vector<signed_char,std::allocator<signed_char>> *)&(this->refactor_info_).pivot_type
    ;
    local_38 = (vector<int,std::allocator<int>> *)&this->l_index;
    local_40 = (vector<double,std::allocator<double>> *)&this->l_value;
    local_80 = &this->l_start;
    local_60 = (vector<int,std::allocator<int>> *)&this->u_index;
    local_48 = (vector<double,std::allocator<double>> *)&this->u_value;
    local_88 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
    local_90 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
    local_98 = &this->u_start;
    local_c0 = &this->log_options;
    uVar42 = 0;
    uVar43 = 0;
    local_188 = 0.0;
    local_158 = 0.0;
    local_c8 = 0.0;
    local_138 = 0.0;
    local_128 = 0;
    local_b8 = 100;
    do {
      local_170 = (double)CONCAT44(uVar43,uVar42);
      if (local_50 != INFINITY) {
        iVar17 = (int)local_b8;
        uVar20 = (long)((ulong)(uint)((int)local_128 >> 0x1f) << 0x20 | local_128 & 0xffffffff) %
                 (long)iVar17;
        if ((int)uVar20 == 0) {
          HighsTimer::read(local_198->build_timer_,0,(void *)(uVar20 & 0xffffffff),(ulong)uVar16);
          local_c8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - local_c8;
          dVar46 = local_198->time_limit_;
          if (dVar46 / 1000.0 < local_c8) {
            uVar16 = iVar17 / 10;
            if (iVar17 / 10 < 2) {
              uVar16 = 1;
            }
            local_b8 = (ulong)uVar16;
          }
          if (dVar46 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
              (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != dVar46) {
            return -1;
          }
          local_138 = local_138 * 0.9 + (local_c8 / (double)iVar17) * 0.1;
          if (dVar46 < (double)((local_198->kernel_dim - (int)local_128) + 1) * local_138 +
                       (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
            return -1;
          }
          uVar16 = local_198->nwork;
          local_c8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        }
      }
      pHVar30 = local_198;
      uVar21 = 8;
      if ((int)uVar16 < 8) {
        uVar21 = uVar16;
      }
      local_19c = 0xffffffff;
      piVar40 = (local_198->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar37 = piVar40[1];
      local_17c = uVar16;
      if ((long)(int)uVar37 == -1) {
        uVar15 = (local_198->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
        uVar20 = (ulong)(int)uVar15;
        if (uVar20 == 0xffffffffffffffff) {
          uVar37 = local_198->num_basic;
          lVar18 = (long)(int)uVar37;
          uVar15 = local_198->num_row;
          sVar31 = (size_type)(int)uVar15;
          uVar14 = uVar37;
          if ((int)uVar37 < (int)uVar15) {
            uVar14 = uVar15;
          }
          if ((int)uVar14 < 2) goto LAB_0036cbdf;
          local_140 = CONCAT44(local_140._4_4_,uVar21);
          dVar46 = (double)(int)uVar15 * (double)(int)uVar37;
          local_178 = (local_198->mc_min_pivot).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_190 = (local_198->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          piVar34 = (local_198->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar41 = (local_198->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          piVar6 = (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_160 = (local_198->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_e0 = (local_198->col_link_next).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_130 = (local_198->row_link_first).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_e8 = (local_198->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar8 = (local_198->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_a8._0_8_ = piVar8;
          local_110 = (ulong)uVar14;
          iVar17 = 0;
          local_168 = 0xffffffff;
          uVar37 = 0xffffffff;
          bVar12 = false;
          uVar20 = 2;
          dVar45 = dVar46;
          do {
            local_150 = uVar20;
            iVar3 = (int)local_150;
            if (((long)local_150 <= (long)sVar31) &&
               (uVar15 = piVar40[local_150], uVar15 != 0xffffffff)) {
              iVar27 = iVar17;
              do {
                lVar19 = (long)piVar34[(int)uVar15];
                bVar13 = bVar12;
                if (0 < lVar19) {
                  lVar23 = (long)local_190[(int)uVar15];
                  lVar19 = lVar19 + lVar23;
                  do {
                    if (local_178[(int)uVar15] <= ABS(pdVar41[lVar23])) {
                      uVar14 = piVar6[lVar23];
                      dVar44 = (double)(local_160[(int)uVar14] + -1) * (double)(iVar3 + -1);
                      if (dVar44 < dVar45) {
                        bVar12 = (bool)((long)local_160[(int)uVar14] < (long)local_150 | bVar12);
                        dVar45 = dVar44;
                        local_19c = uVar14;
                        local_168 = (long)(int)uVar14;
                        uVar37 = uVar15;
                      }
                    }
                    lVar23 = lVar23 + 1;
                    bVar13 = bVar12;
                  } while (lVar23 < lVar19);
                }
                iVar17 = iVar27 + 1;
                bVar12 = bVar13;
                if (dVar45 < dVar46) {
                  bVar12 = true;
                }
                if (iVar27 < (int)uVar21) {
                  bVar12 = bVar13;
                }
                if (bVar12) break;
                local_170 = local_170 + (double)iVar3;
                uVar15 = local_e0[(int)uVar15];
                iVar27 = iVar17;
              } while (uVar15 != 0xffffffff);
            }
            if ((long)local_150 <= lVar18) {
              uVar15 = local_130[local_150];
              if (uVar15 != 0xffffffff) {
                iVar27 = iVar17;
                do {
                  local_120 = (double)(long)(int)uVar15;
                  bVar13 = bVar12;
                  if (0 < (long)local_160[(long)local_120]) {
                    lVar23 = (long)local_e8[(long)local_120];
                    lVar19 = local_160[(long)local_120] + lVar23;
                    do {
                      uVar14 = (local_198->mr_index).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar23];
                      iVar17 = piVar34[(int)uVar14];
                      dVar44 = (double)(iVar17 + -1) * (double)(iVar3 + -1);
                      if (dVar44 < dVar45) {
                        lVar32 = (long)local_190[(int)uVar14] << 2;
                        do {
                          lVar33 = lVar32 + 4;
                          puVar2 = (uint *)((long)piVar6 + lVar32);
                          lVar32 = lVar33;
                        } while (*puVar2 != uVar15);
                        if (local_178[(int)uVar14] <=
                            ABS(*(double *)((long)pdVar41 + lVar33 * 2 + -8))) {
                          bVar12 = (bool)((long)iVar17 <= (long)local_150 | bVar12);
                          local_168 = (ulong)uVar15;
                          dVar45 = dVar44;
                          local_19c = uVar15;
                          uVar37 = uVar14;
                        }
                      }
                      lVar23 = lVar23 + 1;
                      bVar13 = bVar12;
                    } while (lVar23 < lVar19);
                  }
                  iVar17 = iVar27 + 1;
                  bVar12 = bVar13;
                  if (dVar45 < dVar46) {
                    bVar12 = true;
                  }
                  if (iVar27 < (int)uVar21) {
                    bVar12 = bVar13;
                  }
                } while ((!bVar12) &&
                        (uVar15 = piVar8[(long)local_120], iVar27 = iVar17, uVar15 != 0xffffffff));
              }
              local_170 = local_170 + (double)iVar3;
            }
            local_118 = piVar40;
            local_108 = sVar31;
            local_100 = lVar18;
          } while ((!bVar12) && (uVar20 = local_150 + 1, local_150 < local_110));
        }
        else {
          uVar37 = (local_198->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(local_198->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar20]];
          local_19c = uVar15;
          local_168 = uVar20;
        }
      }
      else {
        local_19c = (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(local_198->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar37]];
        local_168 = (ulong)local_19c;
      }
      if ((int)local_168 < 0) {
LAB_0036cbdf:
        local_198->rank_deficiency = uVar16 + 1;
        highsLogDev(local_c0,kWarning,"Factorization identifies rank deficiency of %d\n");
        return pHVar30->rank_deficiency;
      }
      local_128 = (ulong)((int)local_128 + 1);
      local_d8 = colDelete(local_198,uVar37,(int)local_168);
      lVar23 = (long)(int)local_19c;
      piVar40 = (local_198->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar18 = (long)(local_198->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23];
      lVar19 = (long)piVar40[lVar23] + -1;
      piVar40[lVar23] = (int)lVar19;
      piVar40 = (local_198->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = (uint *)(piVar40 + lVar18);
      do {
        puVar29 = puVar2;
        puVar2 = puVar29 + 1;
      } while (*puVar29 != uVar37);
      *puVar29 = piVar40[lVar19 + lVar18];
      piVar40 = (local_198->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar17 = piVar40[(int)uVar37];
      lVar18 = (long)iVar17;
      piVar34 = (local_198->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = piVar34[(int)uVar37];
      piVar24 = piVar34 + lVar18;
      if (lVar18 < 0) {
        piVar24 = (local_198->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + (-2 - lVar18);
      }
      *piVar24 = iVar3;
      if (-1 < (long)iVar3) {
        piVar40[iVar3] = iVar17;
      }
      piVar40 = (local_198->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar17 = piVar40[(int)local_19c];
      lVar18 = (long)iVar17;
      piVar34 = (local_198->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = piVar34[(int)local_19c];
      piVar24 = piVar34 + lVar18;
      if (lVar18 < 0) {
        piVar24 = (local_198->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + (-2 - lVar18);
      }
      *piVar24 = iVar3;
      if (-1 < (long)iVar3) {
        piVar40[iVar3] = iVar17;
      }
      if (local_198->pivot_tolerance <= ABS(local_d8)) {
        (local_198->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar37] = local_19c;
        iVar4._M_current =
             (local_198->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (local_198->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_68,iVar4,(int *)&local_19c);
        }
        else {
          *iVar4._M_current = local_19c;
          (local_198->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             (local_198->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (local_198->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_70,iVar4,local_198->basic_index + (int)uVar37);
        }
        else {
          *iVar4._M_current = local_198->basic_index[(int)uVar37];
          (local_198->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        __position._M_current =
             (local_198->refactor_info_).pivot_type.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_198->refactor_info_).pivot_type.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<signed_char,std::allocator<signed_char>>::
          _M_realloc_insert<signed_char_const&>(local_78,__position,"\x04buildRankDeficiency0:");
        }
        else {
          *__position._M_current = '\x04';
          ppcVar1 = &(local_198->refactor_info_).pivot_type.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        piVar40 = (pointer)(long)(local_198->mc_start).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar37];
        local_58 = (long)(local_198->mc_count_a).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)uVar37];
        local_140 = local_58 + (long)piVar40;
        pHVar30 = local_198;
        dVar46 = local_188;
        local_130 = piVar40;
        if (local_58 < 1) {
          piVar34 = (pointer)0x0;
        }
        else {
          piVar34 = (pointer)0x0;
          do {
            local_180 = (pHVar30->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)piVar40];
            local_148 = (pHVar30->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)piVar40] / local_d8;
            (pHVar30->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)piVar34] = local_180;
            (pHVar30->mwz_column_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[local_180] = local_148;
            (pHVar30->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[local_180] = '\x01';
            iVar4._M_current =
                 (pHVar30->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (pHVar30->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_38,iVar4,&local_180);
              pHVar30 = local_198;
              dVar46 = local_188;
            }
            else {
              *iVar4._M_current = local_180;
              (pHVar30->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            iVar5._M_current =
                 (pHVar30->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (pHVar30->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_40,iVar5,&local_148);
              pHVar30 = local_198;
              dVar46 = local_188;
            }
            else {
              *iVar5._M_current = local_148;
              (pHVar30->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            piVar34 = (pointer)((long)piVar34 + 1);
            piVar6 = (pHVar30->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            (pHVar30->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_180] = piVar6[local_180];
            lVar19 = (long)local_180;
            lVar18 = (long)(pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar19];
            iVar17 = piVar6[lVar19];
            piVar6[lVar19] = (int)((long)iVar17 + -1);
            piVar6 = (pHVar30->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar2 = (uint *)(piVar6 + lVar18);
            do {
              puVar29 = puVar2;
              puVar2 = puVar29 + 1;
            } while (*puVar29 != uVar37);
            *puVar29 = piVar6[(long)iVar17 + -1 + lVar18];
            piVar40 = (pointer)((long)piVar40 + 1);
          } while ((long)piVar40 < local_140);
        }
        this_00 = local_60;
        iVar17 = (int)((ulong)((long)(pHVar30->l_index).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pHVar30->l_index).super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2);
        local_148 = (double)CONCAT44(local_148._4_4_,iVar17);
        iVar4._M_current =
             (pHVar30->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_190 = piVar34;
        if (iVar4._M_current ==
            (pHVar30->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_80,iVar4,(int *)&local_148);
          pHVar30 = local_198;
          dVar46 = local_188;
        }
        else {
          *iVar4._M_current = iVar17;
          (pHVar30->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_cc = (pHVar30->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar37];
        local_17c = (pHVar30->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar37];
        piVar40 = local_190;
        if (0 < (int)local_17c) {
          iVar17 = (pHVar30->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar37] + (int)local_130;
          lVar23 = (long)(int)(iVar17 - local_17c);
          lVar18 = lVar23 * 4;
          lVar19 = lVar23 * 8;
          do {
            piVar24 = (int *)((long)(pHVar30->mc_index).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar18);
            iVar4._M_current =
                 (pHVar30->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (pHVar30->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,iVar4,piVar24);
              pHVar30 = local_198;
              piVar40 = local_190;
              dVar46 = local_188;
            }
            else {
              *iVar4._M_current = *piVar24;
              (pHVar30->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            __args = (double *)
                     ((long)(pHVar30->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar19);
            iVar5._M_current =
                 (pHVar30->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (pHVar30->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_48,iVar5,__args);
              pHVar30 = local_198;
              piVar40 = local_190;
              dVar46 = local_188;
            }
            else {
              *iVar5._M_current = *__args;
              (pHVar30->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            lVar23 = lVar23 + 1;
            lVar18 = lVar18 + 4;
            lVar19 = lVar19 + 8;
          } while (lVar23 < iVar17);
        }
        iVar4._M_current =
             (pHVar30->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pHVar30->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_88,iVar4,(int *)&local_19c);
          pHVar30 = local_198;
          piVar40 = local_190;
          dVar46 = local_188;
        }
        else {
          *iVar4._M_current = local_19c;
          (pHVar30->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar5._M_current =
             (pHVar30->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (pHVar30->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_90,iVar5,&local_d8);
          pHVar30 = local_198;
          piVar40 = local_190;
          dVar46 = local_188;
        }
        else {
          *iVar5._M_current = local_d8;
          (pHVar30->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar17 = (int)((ulong)((long)(pHVar30->u_index).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pHVar30->u_index).super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2);
        local_148 = (double)CONCAT44(local_148._4_4_,iVar17);
        iVar4._M_current =
             (pHVar30->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pHVar30->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_98,iVar4,(int *)&local_148);
          pHVar30 = local_198;
          piVar40 = local_190;
          dVar46 = local_188;
        }
        else {
          *iVar4._M_current = iVar17;
          (pHVar30->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        lVar18 = (long)(pHVar30->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)local_19c];
        pdVar41 = (pointer)((ulong)piVar40 & 0xffffffff);
        if (0 < lVar18) {
          uVar20 = (ulong)(pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)local_19c];
          local_120 = (double)(int)piVar40;
          local_e0 = (pointer)(lVar18 + uVar20);
          local_118 = (pointer)(double)((int)piVar40 * 2);
          local_178 = pdVar41;
          do {
            iVar17 = (pHVar30->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar20];
            piVar34 = (pointer)(long)iVar17;
            uVar16 = (pHVar30->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar34];
            local_168 = (ulong)uVar16;
            iVar3 = (pHVar30->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)piVar34];
            iVar39 = uVar16 + iVar3 + -1;
            local_150 = uVar20;
            dVar46 = colDelete(pHVar30,iVar17,local_19c);
            iVar27 = (local_198->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar34];
            iVar28 = (local_198->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar34];
            piVar40 = (local_198->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar16 = piVar40[(long)piVar34];
            piVar40[(long)piVar34] = uVar16 + 1;
            iVar27 = ~uVar16 + iVar27 + iVar28;
            (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar27] = local_19c;
            (local_198->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar27] = dVar46;
            if (iVar3 < iVar39) {
              lVar19 = (long)iVar3;
              iVar28 = 0;
              piVar40 = local_190;
              lVar18 = lVar19;
              do {
                pcVar7 = (local_198->mwz_column_mark).
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar27 = (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar18];
                if (pcVar7[iVar27] != '\0') {
                  dVar45 = (local_198->mc_value).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar18];
                  pcVar7[iVar27] = '\0';
                  dVar45 = (local_198->mwz_column_array).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar27] * -dVar46 + dVar45;
                  dVar47 = ABS(dVar45);
                  dVar44 = 0.0;
                  if (1e-14 <= dVar47) {
                    dVar44 = dVar45;
                  }
                  piVar40 = (pointer)(ulong)((int)piVar40 - 1);
                  iVar28 = iVar28 + (uint)(dVar47 < 1e-14);
                  (local_198->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar18] = dVar44;
                }
                iVar27 = (int)piVar40;
                lVar18 = lVar18 + 1;
              } while (iVar39 != lVar18);
              local_158 = (double)(iVar27 * 2) + local_158 + local_120;
              if (0 < iVar28) {
                iVar28 = iVar3;
                if (iVar3 < iVar39) {
                  piVar40 = (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pdVar41 = (local_198->mc_value).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar6 = (local_198->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  piVar8 = (local_198->mr_count).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  piVar9 = (local_198->mr_index).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  do {
                    dVar45 = pdVar41[lVar19];
                    iVar22 = piVar40[lVar19];
                    if ((dVar45 != 0.0) || (NAN(dVar45))) {
                      piVar40[iVar28] = iVar22;
                      pdVar41[iVar28] = dVar45;
                      iVar28 = iVar28 + 1;
                    }
                    else {
                      lVar18 = (long)piVar6[iVar22];
                      lVar23 = (long)piVar8[iVar22] + -1;
                      piVar8[iVar22] = (int)lVar23;
                      piVar24 = piVar9 + lVar18;
                      do {
                        piVar36 = piVar24;
                        piVar24 = piVar36 + 1;
                      } while (*piVar36 != iVar17);
                      *piVar36 = piVar9[lVar23 + lVar18];
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != iVar39);
                }
                (local_198->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar34] = iVar28 - iVar3;
              }
            }
            else {
              local_158 = local_158 + local_120 + (double)local_118;
              iVar27 = (int)local_190;
            }
            pHVar30 = local_198;
            pdVar41 = local_178;
            local_160 = piVar34;
            if (iVar27 < 1) {
LAB_0036c997:
              if ((int)local_190 != 0) {
                pdVar26 = (pointer)0x0;
                do {
                  (pHVar30->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [(pHVar30->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start[(long)pdVar26]] = '\x01';
                  pdVar26 = (pointer)((long)pdVar26 + 1);
                } while (pdVar41 != pdVar26);
              }
            }
            else {
              piVar40 = (local_198->mc_count_n).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              iVar3 = (local_198->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)piVar34];
              iVar28 = piVar40[(long)piVar34];
              piVar6 = (local_198->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar39 = piVar6[(long)piVar34];
              uVar42 = SUB84(dVar46,0);
              uVar43 = (int)((ulong)dVar46 >> 0x20);
              if (iVar39 < iVar3 + iVar27 + iVar28) {
                local_e8 = (pointer)CONCAT44(local_e8._4_4_,iVar28);
                local_a8._8_4_ = extraout_XMM0_Dc;
                local_a8._0_8_ = dVar46;
                local_a8._12_4_ = extraout_XMM0_Dd;
                piVar8 = (local_198->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start;
                iVar28 = piVar8[(long)piVar34];
                lVar18 = (long)iVar28;
                local_100 = CONCAT44(local_100._4_4_,iVar28);
                if (iVar27 < iVar39) {
                  iVar27 = iVar39;
                }
                piVar6[(long)piVar34] = iVar27 + iVar39;
                iVar27 = (int)((ulong)((long)(local_198->mc_index).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(local_198->mc_index).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2);
                piVar8[(long)piVar34] = iVar27;
                lVar19 = (long)iVar27;
                local_108 = piVar6[(long)piVar34] + lVar19;
                local_110 = (ulong)piVar40[(long)piVar34];
                std::vector<int,_std::allocator<int>_>::resize(local_f0,local_108);
                std::vector<double,_std::allocator<double>_>::resize
                          (local_f8,(local_198->mc_space).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[(long)piVar34] + lVar19);
                lVar23 = (long)(iVar3 + iVar28);
                sVar25 = lVar23 * 4 + lVar18 * -4;
                if (sVar25 != 0) {
                  piVar40 = (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  memmove(piVar40 + lVar19,piVar40 + lVar18,sVar25);
                }
                sVar25 = lVar23 * 8 + lVar18 * -8;
                if (sVar25 != 0) {
                  pdVar41 = (local_f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  memmove(pdVar41 + lVar19,pdVar41 + lVar18,sVar25);
                }
                iVar39 = iVar39 + (int)local_100;
                lVar18 = (long)(int)local_108 - local_110;
                lVar19 = (long)(iVar39 - (int)local_e8);
                sVar25 = (long)iVar39 * 4 + lVar19 * -4;
                if (sVar25 != 0) {
                  piVar40 = (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  memmove(piVar40 + lVar18,piVar40 + lVar19,sVar25);
                }
                sVar25 = (long)iVar39 * 8 + lVar19 * -8;
                uVar42 = local_a8._0_4_;
                uVar43 = local_a8._4_4_;
                if (sVar25 != 0) {
                  pdVar41 = (local_f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  memmove(pdVar41 + lVar18,pdVar41 + lVar19,sVar25);
                  uVar42 = local_a8._0_4_;
                  uVar43 = local_a8._4_4_;
                }
              }
              pHVar30 = local_198;
              piVar34 = local_160;
              pdVar41 = local_178;
              if ((int)local_190 != 0) {
                piVar40 = (local_198->mwz_column_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pcVar7 = (local_198->mwz_column_mark).
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar26 = (local_198->mwz_column_array).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar6 = (local_198->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start;
                piVar8 = (local_198->mc_count_a).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                piVar9 = (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar10 = (local_198->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pdVar35 = (pointer)0x0;
                do {
                  iVar3 = piVar40[(long)pdVar35];
                  if (pcVar7[iVar3] != '\0') {
                    dVar46 = pdVar26[iVar3];
                    iVar27 = piVar6[(long)local_160];
                    iVar28 = piVar8[(long)local_160];
                    piVar8[(long)local_160] = iVar28 + 1;
                    lVar18 = (long)iVar27 + (long)iVar28;
                    piVar9[lVar18] = iVar3;
                    pdVar10[lVar18] = dVar46 * -(double)CONCAT44(uVar43,uVar42);
                  }
                  pdVar35 = (pointer)((long)pdVar35 + 1);
                } while (local_178 != pdVar35);
                if ((int)local_190 != 0) {
                  pdVar26 = (pointer)0x0;
                  do {
                    iVar3 = (pHVar30->mwz_column_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)pdVar26];
                    if ((pHVar30->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar3] != '\0') {
                      piVar40 = (pHVar30->mr_space).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      iVar27 = (pHVar30->mr_count).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar3];
                      if (iVar27 == piVar40[iVar3]) {
                        piVar34 = (pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar28 = piVar34[iVar3];
                        uVar20 = (long)(pHVar30->mr_index).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(pHVar30->mr_index).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start;
                        iVar22 = (int)(uVar20 >> 2);
                        piVar34[iVar3] = iVar22;
                        iVar39 = piVar40[iVar3];
                        piVar40[iVar3] = iVar39 * 2;
                        std::vector<int,_std::allocator<int>_>::resize
                                  (local_b0,(long)iVar22 + (long)iVar39 * 2);
                        sVar25 = (long)iVar27 * 4;
                        pHVar30 = local_198;
                        if (sVar25 != 0) {
                          piVar40 = (local_b0->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start;
                          memmove((void *)(((long)(uVar20 * 0x40000000) >> 0x1e) + (long)piVar40),
                                  piVar40 + iVar28,sVar25);
                          pHVar30 = local_198;
                        }
                      }
                      piVar40 = (pHVar30->mr_count).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      iVar27 = (pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar3];
                      iVar28 = piVar40[iVar3];
                      piVar40[iVar3] = iVar28 + 1;
                      (pHVar30->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar27 + (long)iVar28] = iVar17;
                      piVar34 = local_160;
                      pdVar41 = local_178;
                    }
                    pdVar26 = (pointer)((long)pdVar26 + 1);
                  } while (pdVar41 != pdVar26);
                  goto LAB_0036c997;
                }
              }
            }
            colFixMax(pHVar30,iVar17);
            piVar40 = (local_198->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((int)local_168 != piVar40[(long)piVar34]) {
              piVar6 = (local_198->col_link_last).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              iVar3 = piVar6[(long)piVar34];
              lVar18 = (long)iVar3;
              piVar8 = (local_198->col_link_first).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              piVar9 = (local_198->col_link_next).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              iVar27 = piVar9[(long)piVar34];
              piVar24 = piVar9 + lVar18;
              if (lVar18 < 0) {
                piVar24 = piVar8 + (-2 - lVar18);
              }
              *piVar24 = iVar27;
              if (-1 < (long)iVar27) {
                piVar6[iVar27] = iVar3;
              }
              iVar3 = piVar40[(long)piVar34];
              iVar27 = piVar8[iVar3];
              piVar6[(long)piVar34] = -2 - iVar3;
              piVar9[(long)piVar34] = iVar27;
              piVar8[iVar3] = iVar17;
              if (-1 < (long)iVar27) {
                piVar6[iVar27] = iVar17;
              }
            }
            uVar20 = local_150 + 1;
            pHVar30 = local_198;
            dVar46 = local_188;
          } while ((long)uVar20 < (long)local_e0);
        }
        if ((int)local_190 != 0) {
          pdVar26 = (pointer)0x0;
          do {
            (pHVar30->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start
            [(pHVar30->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pdVar26]] = '\0';
            pdVar26 = (pointer)((long)pdVar26 + 1);
          } while (pdVar41 != pdVar26);
        }
        if (0 < (int)local_58) {
          piVar40 = (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar34 = (local_198->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar6 = (local_198->mr_count_before).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          piVar8 = (local_198->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar9 = (local_198->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar38 = local_130;
          do {
            iVar17 = piVar40[(long)piVar38];
            if (piVar6[iVar17] != piVar34[iVar17]) {
              iVar3 = piVar8[iVar17];
              lVar18 = (long)iVar3;
              iVar27 = piVar9[iVar17];
              piVar11 = (local_198->row_link_first).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              piVar24 = piVar9 + lVar18;
              if (lVar18 < 0) {
                piVar24 = piVar11 + (-2 - lVar18);
              }
              *piVar24 = iVar27;
              if (-1 < (long)iVar27) {
                piVar8[iVar27] = iVar3;
              }
              iVar3 = piVar34[iVar17];
              iVar27 = piVar11[iVar3];
              piVar8[iVar17] = -2 - iVar3;
              piVar9[iVar17] = iVar27;
              piVar11[iVar3] = iVar17;
              if (-1 < (long)iVar27) {
                piVar8[iVar27] = iVar17;
              }
            }
            piVar38 = (pointer)((long)piVar38 + 1);
          } while ((long)piVar38 < (long)(int)local_140);
        }
        local_188 = dVar46 + (double)(local_cc * 2) + (double)(int)local_17c;
        iVar17 = local_198->nwork;
        uVar42 = SUB84(local_170,0);
        uVar43 = (undefined4)((ulong)local_170 >> 0x20);
      }
      else {
        highsLogDev(local_c0,kWarning,"Defer singular pivot = %11.4g\n");
        if ((local_198->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)local_19c] == 0) {
          piVar40 = (local_198->col_link_first).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          iVar17 = (local_198->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar37];
          lVar18 = (long)iVar17;
          uVar16 = piVar40[lVar18];
          piVar34 = (local_198->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          piVar34[(int)uVar37] = -2 - iVar17;
          (local_198->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar37] = uVar16;
        }
        else {
          zeroCol(local_198,uVar37);
          lVar19 = (long)(int)local_19c;
          piVar40 = (local_198->row_link_first).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          iVar17 = (local_198->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar19];
          lVar18 = (long)iVar17;
          uVar16 = piVar40[lVar18];
          piVar34 = (local_198->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          piVar34[lVar19] = -2 - iVar17;
          (local_198->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar19] = uVar16;
          uVar37 = local_19c;
        }
        piVar40[lVar18] = uVar37;
        uVar42 = SUB84(local_170,0);
        uVar43 = (undefined4)((ulong)local_170 >> 0x20);
        if (-1 < (int)uVar16) {
          piVar34[uVar16] = uVar37;
        }
        iVar17 = local_198->nwork + 1;
      }
      uVar16 = iVar17 - 1;
      local_198->nwork = uVar16;
    } while (0 < iVar17);
    local_188 = local_188 * 160.0;
  }
  local_198->build_synthetic_tick =
       local_158 * 80.0 + (double)CONCAT44(uVar43,uVar42) * 20.0 + local_188 +
       local_198->build_synthetic_tick;
  local_198->rank_deficiency = 0;
  return 0;
}

Assistant:

HighsInt HFactor::buildKernel() {
  // Deal with the kernel part by 'n-work' pivoting

  double fake_search = 0;
  double fake_fill = 0;
  double fake_eliminate = 0;

  const bool progress_report = false;  // num_basic != num_row;
  const HighsInt progress_frequency = 10000;
  // Initial timer frequency: may be reduced if iterations get slow
  HighsInt timer_frequency = 100;
  double previous_iteration_time = 0;
  double average_iteration_time = 0;
  const bool check_for_timeout = this->time_limit_ < kHighsInf;
  HighsInt search_k = 0;

  const HighsInt check_nwork = -11;
  while (nwork-- > 0) {
    //    printf("\nnwork = %d\n", (int)nwork);
    if (nwork == check_nwork) {
      reportAsm();
    }
    // Determine whether to return due to exceeding the time limit
    if (check_for_timeout && search_k % timer_frequency == 0) {
      double current_time = build_timer_->read();
      double time_difference = current_time - previous_iteration_time;
      previous_iteration_time = current_time;
      double iteration_time = time_difference / (1.0 * timer_frequency);
      average_iteration_time =
          0.9 * average_iteration_time + 0.1 * iteration_time;

      if (time_difference > this->time_limit_ / 1e3)
        timer_frequency = std::max(HighsInt(1), timer_frequency / 10);
      HighsInt iterations_left = kernel_dim - search_k + 1;
      double remaining_time_bound = average_iteration_time * iterations_left;
      double total_time_bound = current_time + remaining_time_bound;
      if (current_time > this->time_limit_ ||
          total_time_bound > this->time_limit_)
        return kBuildKernelReturnTimeout;
    }

    /**
     * 1. Search for the pivot
     */
    HighsInt jColPivot = -1;
    HighsInt iRowPivot = -1;
    //    int8_t pivot_type = kPivotIllegal;
    // 1.1. Setup search merits
    HighsInt searchLimit = min(nwork, HighsInt{8});
    HighsInt searchCount = 0;

    double merit_limit = 1.0 * num_basic * num_row;
    double merit_pivot = merit_limit;

    if (progress_report && search_k) {
      if (search_k % progress_frequency == 0) {
        HighsInt min_col_count = kHighsIInf;
        HighsInt min_row_count = kHighsIInf;
        for (HighsInt count = 1; count < num_row; count++) {
          if (col_link_first[count] >= 0) {
            min_col_count = count;
            break;
          }
        }
        for (HighsInt count = 1; count < num_basic; count++) {
          if (row_link_first[count] >= 0) {
            min_row_count = count;
            break;
          }
        }
        printf(
            "HFactor::buildKernel stage = %6d: min_col_count = %3d; "
            "min_row_count = %3d\n",
            (int)search_k, (int)min_col_count, (int)min_row_count);
      }
    }
    search_k++;
    // 1.2. Search for local singletons
    bool foundPivot = false;
    //    jColPivot = col_link_first[1];
    if (!foundPivot && col_link_first[1] != -1) {
      // Not yet found a pivot and there is at least one column
      // singleton
      jColPivot = col_link_first[1];
      iRowPivot = mc_index[mc_start[jColPivot]];
      foundPivot = true;
    }
    if (!foundPivot && row_link_first[1] != -1) {
      iRowPivot = row_link_first[1];
      jColPivot = mr_index[mr_start[iRowPivot]];
      foundPivot = true;
    }
    const bool singleton_pivot = foundPivot;
#ifndef NDEBUG
    double candidate_pivot_value = 0;
#endif
    // 1.3. Major search loop
    //
    // Row count can be more than the number of rows if num_basic >
    // num_row
    const HighsInt max_count = max(num_row, num_basic);
    for (HighsInt count = 2; !foundPivot && count <= max_count; count++) {
      // Column count cannot exceed the number of rows
      if (count <= num_row) {
        // 1.3.1 Search for columns
        for (HighsInt j = col_link_first[count]; j != -1;
             j = col_link_next[j]) {
          double min_pivot = mc_min_pivot[j];
          HighsInt start = mc_start[j];
          HighsInt end = start + mc_count_a[j];
          for (HighsInt k = start; k < end; k++) {
            if (fabs(mc_value[k]) >= min_pivot) {
              HighsInt i = mc_index[k];
              HighsInt row_count = mr_count[i];
              double merit_local = 1.0 * (count - 1) * (row_count - 1);
              if (merit_pivot > merit_local) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[k]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (row_count < count);
              }
            }
          }

          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;

          fake_search += count;
        }
      }

      // Row count cannot exceed the number of basic variables
      if (count <= num_basic) {
        // 1.3.2 Search for rows
        for (HighsInt i = row_link_first[count]; i != -1;
             i = row_link_next[i]) {
          HighsInt start = mr_start[i];
          HighsInt end = start + mr_count[i];
          for (HighsInt k = start; k < end; k++) {
            HighsInt j = mr_index[k];
            HighsInt column_count = mc_count_a[j];
            double merit_local = 1.0 * (count - 1) * (column_count - 1);
            if (merit_local < merit_pivot) {
              HighsInt ifind = mc_start[j];
              while (mc_index[ifind] != i) ifind++;
              if (fabs(mc_value[ifind]) >= mc_min_pivot[j]) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[ifind]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (column_count <= count);
              }
            }
          }
          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;
        }

        fake_search += count;
      }
    }
    // 1.4. If we found nothing: tell singular
    if (iRowPivot < 0) {
      // To detect the absence of a pivot, it should be sufficient
      // that iRowPivot is (still) -1, but add sanity asserts that
      // jColPivot is (still) -1 and foundPivot is false
      assert(jColPivot < 0);
      assert(!foundPivot);
      rank_deficiency = nwork + 1;
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Factorization identifies rank deficiency of %d\n",
                  (int)rank_deficiency);
      return rank_deficiency;
    }

    /**
     * 2. Elimination other elements by the pivot
     */
#ifndef NDEBUG
    const HighsInt original_pivotal_row_count = mr_count[iRowPivot];
    const HighsInt original_pivotal_col_count = mc_count_a[jColPivot];
#endif
    // 2.1. Delete the pivot
    //
    // Remove the pivot row index from the pivotal column of the
    // col-wise matrix. Also decreases the column count
    double pivot_multiplier = colDelete(jColPivot, iRowPivot);
    // Remove the pivot column index from the pivotal row of the
    // row-wise matrix. Also decreases the row count
    rowDelete(jColPivot, iRowPivot);
    // Remove the pivotal column from the linked list of columns
    // containing it
    clinkDel(jColPivot);
    // Remove the pivotal row from the linked list of rows containing
    // it
    rlinkDel(iRowPivot);
    if (!singleton_pivot)
      assert(candidate_pivot_value == fabs(pivot_multiplier));
    if (fabs(pivot_multiplier) < pivot_tolerance) {
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Defer singular pivot = %11.4g\n", pivot_multiplier);
      // Matrix is singular, but defer return since other valid pivots
      // may exist.
      assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
      if (mr_count[iRowPivot] == 0) {
        // The pivot corresponds to a singleton row. Entry is zeroed,
        // and do no more since there may be other valid entries in
        // the pivotal column
        //
        // Add the pivotal column to the linked list of columns with
        // its new count
        assert(mc_count_a[jColPivot] == original_pivotal_col_count - 1);
        clinkAdd(jColPivot, mc_count_a[jColPivot]);
      } else {
        // Otherwise, other entries in the pivotal column will be
        // smaller than the pivot, so zero the column
        zeroCol(jColPivot);
        // Add the pivotal row to the linked list of rows with its new
        // count
        assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
        rlinkAdd(iRowPivot, mr_count[iRowPivot]);
      }
      // No pivot found, so have to increment nwork
      nwork++;
      continue;
    }
    permute[jColPivot] = iRowPivot;
    assert(mc_var[jColPivot] == basic_index[jColPivot]);

    this->refactor_info_.pivot_row.push_back(iRowPivot);
    this->refactor_info_.pivot_var.push_back(basic_index[jColPivot]);
    this->refactor_info_.pivot_type.push_back(kPivotMarkowitz);

    // 2.2. Store active pivot column to L
    HighsInt start_A = mc_start[jColPivot];
    HighsInt end_A = start_A + mc_count_a[jColPivot];
    HighsInt mwz_column_count = 0;
    for (HighsInt k = start_A; k < end_A; k++) {
      const HighsInt iRow = mc_index[k];
      const double value = mc_value[k] / pivot_multiplier;
      mwz_column_index[mwz_column_count++] = iRow;
      mwz_column_array[iRow] = value;
      mwz_column_mark[iRow] = 1;
      l_index.push_back(iRow);
      l_value.push_back(value);
      mr_count_before[iRow] = mr_count[iRow];
      rowDelete(jColPivot, (int)iRow);
    }
    l_start.push_back(l_index.size());
    fake_fill += 2 * mc_count_a[jColPivot];

    // 2.3. Store non active pivot column to U
    HighsInt end_N = start_A + mc_space[jColPivot];
    HighsInt start_N = end_N - mc_count_n[jColPivot];
    for (HighsInt i = start_N; i < end_N; i++) {
      u_index.push_back(mc_index[i]);
      u_value.push_back(mc_value[i]);
    }
    u_pivot_index.push_back(iRowPivot);
    u_pivot_value.push_back(pivot_multiplier);
    u_start.push_back(u_index.size());
    fake_fill += end_N - start_N;

    // 2.4. Loop over pivot row to eliminate other column
    const HighsInt row_start = mr_start[iRowPivot];
    const HighsInt row_end = row_start + mr_count[iRowPivot];
    for (HighsInt row_k = row_start; row_k < row_end; row_k++) {
      // 2.4.1. My pointer
      HighsInt iCol = mr_index[row_k];
      const HighsInt my_count = mc_count_a[iCol];
      const HighsInt my_start = mc_start[iCol];
      const HighsInt my_end = my_start + my_count - 1;
      double my_pivot = colDelete(iCol, iRowPivot);
      colStoreN(iCol, iRowPivot, my_pivot);

      // 2.4.2. Elimination on the overlapping part
      HighsInt nFillin = mwz_column_count;
      HighsInt nCancel = 0;
      for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
        HighsInt iRow = mc_index[my_k];
        double value = mc_value[my_k];
        if (mwz_column_mark[iRow]) {
          mwz_column_mark[iRow] = 0;
          nFillin--;
          value -= my_pivot * mwz_column_array[iRow];
          if (fabs(value) < kHighsTiny) {
            value = 0;
            nCancel++;
          }
          mc_value[my_k] = value;
        }
      }
      fake_eliminate += mwz_column_count;
      fake_eliminate += nFillin * 2;

      // 2.4.3. Remove cancellation gaps
      if (nCancel > 0) {
        HighsInt new_end = my_start;
        for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
          if (mc_value[my_k] != 0) {
            mc_index[new_end] = mc_index[my_k];
            mc_value[new_end++] = mc_value[my_k];
          } else {
            rowDelete(iCol, mc_index[my_k]);
          }
        }
        mc_count_a[iCol] = new_end - my_start;
      }

      // 2.4.4. Insert fill-in
      if (nFillin > 0) {
        // 2.4.4.1 Check column size
        if (mc_count_a[iCol] + mc_count_n[iCol] + nFillin > mc_space[iCol]) {
          // p1&2=active, p3&4=non active, p5=new p1, p7=new p3
          HighsInt p1 = mc_start[iCol];
          HighsInt p2 = p1 + mc_count_a[iCol];
          HighsInt p3 = p1 + mc_space[iCol] - mc_count_n[iCol];
          HighsInt p4 = p1 + mc_space[iCol];
          mc_space[iCol] += max(mc_space[iCol], nFillin);
          HighsInt p5 = mc_start[iCol] = mc_index.size();
          HighsInt p7 = p5 + mc_space[iCol] - mc_count_n[iCol];
          mc_index.resize(p5 + mc_space[iCol]);
          mc_value.resize(p5 + mc_space[iCol]);
          copy(&mc_index[p1], &mc_index[p2], &mc_index[p5]);
          copy(&mc_value[p1], &mc_value[p2], &mc_value[p5]);
          copy(&mc_index[p3], &mc_index[p4], &mc_index[p7]);
          copy(&mc_value[p3], &mc_value[p4], &mc_value[p7]);
        }

        // 2.4.4.2 Fill into column copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow])
            colInsert(iCol, iRow, -my_pivot * mwz_column_array[iRow]);
        }

        // 2.4.4.3 Fill into the row copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow]) {
            // Expand row space
            if (mr_count[iRow] == mr_space[iRow]) {
              HighsInt p1 = mr_start[iRow];
              HighsInt p2 = p1 + mr_count[iRow];
              HighsInt p3 = mr_start[iRow] = mr_index.size();
              mr_space[iRow] *= 2;
              mr_index.resize(p3 + mr_space[iRow]);
              copy(&mr_index[p1], &mr_index[p2], &mr_index[p3]);
            }
            rowInsert(iCol, iRow);
          }
        }
      }

      // 2.4.5. Reset pivot column mark
      for (HighsInt i = 0; i < mwz_column_count; i++)
        mwz_column_mark[mwz_column_index[i]] = 1;

      // 2.4.6. Fix max value and link list
      colFixMax(iCol);
      if (my_count != mc_count_a[iCol]) {
        clinkDel(iCol);
        clinkAdd(iCol, mc_count_a[iCol]);
      }
    }

    // 2.5. Clear pivot column buffer
    for (HighsInt i = 0; i < mwz_column_count; i++)
      mwz_column_mark[mwz_column_index[i]] = 0;

    // 2.6. Correct row links for the remain active part
    for (HighsInt i = start_A; i < end_A; i++) {
      HighsInt iRow = mc_index[i];
      if (mr_count_before[iRow] != mr_count[iRow]) {
        rlinkDel(iRow);
        rlinkAdd(iRow, mr_count[iRow]);
      }
    }
  }
  build_synthetic_tick +=
      fake_search * 20 + fake_fill * 160 + fake_eliminate * 80;
  rank_deficiency = 0;
  return rank_deficiency;
}